

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O1

LY_ERR ly_getutf8(char **input,uint32_t *utf8_char,size_t *bytes_read)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  LY_ERR LVar4;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  bool bVar8;
  
  pbVar2 = (byte *)*input;
  bVar1 = *pbVar2;
  uVar5 = (uint)(char)bVar1;
  if ((char)bVar1 < '\0') {
    if ((uVar5 & 0xe0) == 0xc0) {
      if (((pbVar2[1] & 0xc0) == 0x80) && (uVar5 = (uVar5 & 0x1f) << 6, 0x7f < uVar5)) {
        uVar5 = pbVar2[1] & 0x3f | uVar5;
        sVar6 = 2;
        goto LAB_0010ec42;
      }
    }
    else if ((uVar5 & 0xf0) == 0xe0) {
      uVar5 = uVar5 & 0xf;
      bVar1 = pbVar2[1];
      bVar8 = true;
      if ((bVar1 & 0xc0) == 0x80) {
        lVar3 = 0;
        do {
          lVar7 = lVar3;
          uVar5 = bVar1 & 0x3f | uVar5 << 6;
          if (lVar7 == 1) break;
          bVar1 = pbVar2[lVar7 + 2];
          lVar3 = lVar7 + 1;
        } while ((bVar1 & 0xc0) == 0x80);
        bVar8 = lVar7 + 1U < 2;
      }
      if (((!bVar8) && (0x7ff < uVar5)) &&
         (sVar6 = 3, uVar5 < 0xfffe && (uVar5 & 0xfffff800) != 0xd800)) goto LAB_0010ec42;
    }
    else if ((uVar5 & 0xf8) == 0xf0) {
      uVar5 = uVar5 & 7;
      bVar1 = pbVar2[1];
      bVar8 = true;
      if ((bVar1 & 0xc0) == 0x80) {
        lVar3 = 0;
        do {
          lVar7 = lVar3;
          uVar5 = bVar1 & 0x3f | uVar5 << 6;
          if (lVar7 == 2) break;
          bVar1 = pbVar2[lVar7 + 2];
          lVar3 = lVar7 + 1;
        } while ((bVar1 & 0xc0) == 0x80);
        bVar8 = lVar7 + 1U < 3;
      }
      if ((!bVar8) && (sVar6 = 4, 0xffef0fff < uVar5 - 0x110000)) goto LAB_0010ec42;
    }
  }
  else {
    sVar6 = 1;
    if ((0x1f < bVar1) || ((bVar1 < 0xe && ((0x2600U >> (bVar1 & 0x1f) & 1) != 0)))) {
LAB_0010ec42:
      *utf8_char = uVar5;
      *input = (char *)(pbVar2 + sVar6);
      LVar4 = LY_SUCCESS;
      if (bytes_read == (size_t *)0x0) {
        return LY_SUCCESS;
      }
      goto LAB_0010ec5f;
    }
  }
  LVar4 = LY_EINVAL;
  if (bytes_read == (size_t *)0x0) {
    return LY_EINVAL;
  }
  sVar6 = 0;
LAB_0010ec5f:
  *bytes_read = sVar6;
  return LVar4;
}

Assistant:

LY_ERR
ly_getutf8(const char **input, uint32_t *utf8_char, size_t *bytes_read)
{
    uint32_t c, aux;
    size_t len;

    c = (*input)[0];

    if (!(c & 0x80)) {
        /* one byte character */
        len = 1;

        if ((c < 0x20) && (c != 0x9) && (c != 0xa) && (c != 0xd)) {
            goto error;
        }
    } else if ((c & 0xe0) == 0xc0) {
        /* two bytes character */
        len = 2;

        aux = (*input)[1];
        if ((aux & 0xc0) != 0x80) {
            goto error;
        }
        c = ((c & 0x1f) << 6) | (aux & 0x3f);

        if (c < 0x80) {
            goto error;
        }
    } else if ((c & 0xf0) == 0xe0) {
        /* three bytes character */
        len = 3;

        c &= 0x0f;
        for (uint64_t i = 1; i <= 2; i++) {
            aux = (*input)[i];
            if ((aux & 0xc0) != 0x80) {
                goto error;
            }

            c = (c << 6) | (aux & 0x3f);
        }

        if ((c < 0x800) || ((c > 0xd7ff) && (c < 0xe000)) || (c > 0xfffd)) {
            goto error;
        }
    } else if ((c & 0xf8) == 0xf0) {
        /* four bytes character */
        len = 4;

        c &= 0x07;
        for (uint64_t i = 1; i <= 3; i++) {
            aux = (*input)[i];
            if ((aux & 0xc0) != 0x80) {
                goto error;
            }

            c = (c << 6) | (aux & 0x3f);
        }

        if ((c < 0x1000) || (c > 0x10ffff)) {
            goto error;
        }
    } else {
        goto error;
    }

    (*utf8_char) = c;
    (*input) += len;
    if (bytes_read) {
        (*bytes_read) = len;
    }
    return LY_SUCCESS;

error:
    if (bytes_read) {
        (*bytes_read) = 0;
    }
    return LY_EINVAL;
}